

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::wait_set_reg32(IxgbeDevice *this,uint64_t reg,uint32_t mask)

{
  uint32_t cur;
  uint local_78;
  uint local_74;
  uint64_t local_70;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>,_const_unsigned_int_&>_>
  local_68;
  
  local_78 = mask;
  local_70 = reg;
  while (local_74 = *(uint *)(this->addr + local_70), (local_78 & ~local_74) != 0) {
    local_68.list.first.first.first.first.first.second = "waiting for flags ";
    local_68.list.first.first.first.second = " in register ";
    local_68.list.first.first.second = &local_70;
    local_68.list.first.second = ", current value ";
    local_68.list.first.first.first.first.second = &local_78;
    local_68.list.second = &local_74;
    debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>,char_const*>,unsigned_long_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x1ee,"wait_set_reg32",&local_68);
    local_68.list.first.first.first.first.first._0_8_ = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_68);
  }
  return;
}

Assistant:

inline void IxgbeDevice::wait_set_reg32(uint64_t reg, uint32_t mask) {
    __asm__ volatile ("" : : : "memory");
    uint32_t cur;
    while (cur = *(reinterpret_cast<volatile uint32_t *>(addr + reg)), (cur & mask) != mask) {
        debug("waiting for flags " << mask << " in register " << reg << ", current value " << cur);
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        __asm__ volatile ("" : : : "memory");
    }
}